

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<unsigned_int> * __thiscall
kj::ArrayBuilder<unsigned_int>::operator=
          (ArrayBuilder<unsigned_int> *this,ArrayBuilder<unsigned_int> *other)

{
  RemoveConst<unsigned_int> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (uint *)0x0;
  other->pos = (RemoveConst<unsigned_int> *)0x0;
  other->endPtr = (uint *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }